

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bad_identifiers_proto2.pb.cc
# Opt level: O2

uint8_t * __thiscall
proto2_unittest::TestConflictingSymbolNames_BadKnownNamesFields::_InternalSerialize
          (TestConflictingSymbolNames_BadKnownNamesFields *this,uint8_t *target,
          EpsCopyOutputStream *stream)

{
  ulong uVar1;
  anon_union_28_1_493b367e_for_TestConflictingSymbolNames_BadKnownNamesFields_3 aVar2;
  uint8_t *puVar3;
  
  aVar2 = this->field_0;
  if (((undefined1  [28])aVar2 & (undefined1  [28])0x1) != (undefined1  [28])0x0) {
    target = google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<1>
                       (stream,(this->field_0)._impl_.unknown_fields__,target);
  }
  if (((undefined1  [28])aVar2 & (undefined1  [28])0x2) != (undefined1  [28])0x0) {
    target = google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<2>
                       (stream,(this->field_0)._impl_.mutable_unknown_fields__,target);
  }
  if (((undefined1  [28])aVar2 & (undefined1  [28])0x4) != (undefined1  [28])0x0) {
    target = google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<3>
                       (stream,(this->field_0)._impl_.descriptor__,target);
  }
  if (((undefined1  [28])aVar2 & (undefined1  [28])0x8) != (undefined1  [28])0x0) {
    target = google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<4>
                       (stream,(this->field_0)._impl_.default_instance__,target);
  }
  if (((undefined1  [28])aVar2 & (undefined1  [28])0x10) != (undefined1  [28])0x0) {
    target = google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<5>
                       (stream,(this->field_0)._impl_.swap_,target);
  }
  uVar1 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar1 & 1) == 0) {
    return target;
  }
  puVar3 = google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                     ((UnknownFieldSet *)((uVar1 & 0xfffffffffffffffe) + 8),target,stream);
  return puVar3;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestConflictingSymbolNames_BadKnownNamesFields::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestConflictingSymbolNames_BadKnownNamesFields& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:proto2_unittest.TestConflictingSymbolNames.BadKnownNamesFields)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // optional int32 unknown_fields = 1;
  if ((cached_has_bits & 0x00000001u) != 0) {
    target =
        ::google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<1>(
            stream, this_._internal_unknown_fields_(), target);
  }

  // optional int32 mutable_unknown_fields = 2;
  if ((cached_has_bits & 0x00000002u) != 0) {
    target =
        ::google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<2>(
            stream, this_._internal_mutable_unknown_fields_(), target);
  }

  // optional int32 descriptor = 3;
  if ((cached_has_bits & 0x00000004u) != 0) {
    target =
        ::google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<3>(
            stream, this_._internal_descriptor_(), target);
  }

  // optional int32 default_instance = 4;
  if ((cached_has_bits & 0x00000008u) != 0) {
    target =
        ::google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<4>(
            stream, this_._internal_default_instance_(), target);
  }

  // optional int32 swap = 5;
  if ((cached_has_bits & 0x00000010u) != 0) {
    target =
        ::google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<5>(
            stream, this_._internal_swap(), target);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:proto2_unittest.TestConflictingSymbolNames.BadKnownNamesFields)
  return target;
}